

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptedPDF.cpp
# Opt level: O2

int EncryptedPDF(int argc,char **argv)

{
  EStatusCode EVar1;
  EncryptionOptions *pEVar2;
  PDFDocumentCopyingContext *this;
  PDFParser *this_00;
  unsigned_long uVar3;
  ostream *poVar4;
  uint uVar5;
  unsigned_long inPageIndex;
  char *pcVar6;
  EStatusCodeAndObjectIDType EVar7;
  allocator<char> local_16d2;
  allocator<char> local_16d1;
  string local_16d0;
  string local_16b0;
  undefined1 local_1690 [48];
  string local_1660;
  string local_1640;
  string local_1620;
  PDFCreationSettings local_1600;
  InputFile pdfFile;
  EncryptionOptions local_1570;
  PDFParser parser;
  PDFWriter pdfWriter;
  
  InputFile::InputFile(&pdfFile);
  PDFWriter::PDFWriter(&pdfWriter);
  PDFParser::PDFParser(&parser);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16d0,"PDFWithPasswordDecrypted.pdf",&local_16d1);
  BuildRelativeOutputPath(&local_16b0,argv,&local_16d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1660,"PDFWithPasswordDecrypted.txt",&local_16d2);
  BuildRelativeOutputPath(&local_1640,argv,&local_1660);
  uVar5 = 1;
  LogConfiguration::LogConfiguration((LogConfiguration *)local_1690,true,true,&local_1640);
  pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_1570,pEVar2);
  EncryptionOptions::EncryptionOptions(&local_1600.DocumentEncryptionOptions,&local_1570);
  local_1600.CompressStreams = true;
  local_1600.EmbedFonts = true;
  local_1600.WriteXrefAsXrefStream = false;
  EVar1 = PDFWriter::StartPDF(&pdfWriter,&local_16b0,ePDFVersion13,(LogConfiguration *)local_1690,
                              &local_1600);
  EncryptionOptions::~EncryptionOptions(&local_1600.DocumentEncryptionOptions);
  EncryptionOptions::~EncryptionOptions(&local_1570);
  std::__cxx11::string::~string((string *)(local_1690 + 8));
  std::__cxx11::string::~string((string *)&local_1640);
  std::__cxx11::string::~string((string *)&local_1660);
  std::__cxx11::string::~string((string *)&local_16b0);
  std::__cxx11::string::~string((string *)&local_16d0);
  if (EVar1 == eSuccess) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_16d0,"PDFWithPassword.pdf",(allocator<char> *)&local_1660);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1690,argv[1],(allocator<char> *)&local_1640);
    LocalPathToFileURL((FileURL *)&local_1600,(string *)local_1690);
    RelativeURLToLocalPath(&local_16b0,(FileURL *)&local_1600,&local_16d0);
    FileURL::~FileURL((FileURL *)&local_1600);
    std::__cxx11::string::~string((string *)local_1690);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1620,"user",(allocator<char> *)local_1690);
    PDFParsingOptions::PDFParsingOptions((PDFParsingOptions *)&local_1600,&local_1620);
    this = PDFWriter::CreatePDFCopyingContext
                     (&pdfWriter,&local_16b0,(PDFParsingOptions *)&local_1600);
    std::__cxx11::string::~string((string *)&local_1600);
    std::__cxx11::string::~string((string *)&local_1620);
    std::__cxx11::string::~string((string *)&local_16b0);
    std::__cxx11::string::~string((string *)&local_16d0);
    if (this != (PDFDocumentCopyingContext *)0x0) {
      this_00 = PDFDocumentCopyingContext::GetSourceDocumentParser(this);
      uVar3 = PDFParser::GetPagesCount(this_00);
      for (inPageIndex = 0; uVar3 != inPageIndex; inPageIndex = inPageIndex + 1) {
        EVar7 = PDFDocumentCopyingContext::AppendPDFPageFromPDF(this,inPageIndex);
        if (EVar7.first != eSuccess) {
          poVar4 = std::operator<<((ostream *)&std::cout,"failed to append page ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::operator<<(poVar4," from PDFWithPassword.pdf\n");
          break;
        }
      }
      PDFDocumentCopyingContext::~PDFDocumentCopyingContext(this);
      operator_delete(this,0xd0);
      EVar1 = PDFWriter::EndPDF(&pdfWriter);
      if (EVar1 != eSuccess) {
        std::operator<<((ostream *)&std::cout,"failed in end PDF\n");
      }
      uVar5 = (uint)(EVar1 != eSuccess);
      goto LAB_0012e91f;
    }
    pcVar6 = "failed to initialize copying context from PDFWithPassword.pdf\n";
  }
  else {
    pcVar6 = "failed to start PDF\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar6);
LAB_0012e91f:
  PDFParser::~PDFParser(&parser);
  PDFWriter::~PDFWriter(&pdfWriter);
  InputFile::~InputFile(&pdfFile);
  return uVar5;
}

Assistant:

int EncryptedPDF(int argc, char* argv[])
{
	EStatusCode status = PDFHummus::eSuccess;
	InputFile pdfFile;
	PDFWriter pdfWriter;
	PDFDocumentCopyingContext* copyingContext = NULL;


	PDFParser parser;

	do
	{
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv, "PDFWithPasswordDecrypted.pdf"), ePDFVersion13,
			LogConfiguration(true, true,
				BuildRelativeOutputPath(argv, "PDFWithPasswordDecrypted.txt")));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to start PDF\n";
			break;
		}

		copyingContext = pdfWriter.CreatePDFCopyingContext(
			BuildRelativeInputPath(argv,"PDFWithPassword.pdf"),
			PDFParsingOptions("user"));
		if (!copyingContext)
		{
			cout << "failed to initialize copying context from PDFWithPassword.pdf\n";
			status = PDFHummus::eFailure;
			break;
		}

		unsigned long pagesCount = copyingContext->GetSourceDocumentParser()->GetPagesCount();
		for (unsigned long i = 0; i < pagesCount && status == PDFHummus::eSuccess; ++i) {
			EStatusCodeAndObjectIDType result = copyingContext->AppendPDFPageFromPDF(i);
			if (result.first != PDFHummus::eSuccess)
			{
				cout << "failed to append page "<<(i+1)<<" from PDFWithPassword.pdf\n";
				status = result.first;
				break;
			}

		}

		delete copyingContext;
		copyingContext = NULL;

		status = pdfWriter.EndPDF();
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed in end PDF\n";
			break;
		}

	} while (false);

	delete copyingContext;
	return status == eSuccess ? 0:1;
}